

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3Fts3ExprFree(Fts3Expr *pDel)

{
  long lVar1;
  long in_RDI;
  bool bVar2;
  Fts3Expr *pParent;
  Fts3Expr *p;
  long local_38;
  long local_28;
  long local_10;
  
  local_10 = in_RDI;
  while( true ) {
    bVar2 = false;
    if ((local_10 != 0) && (bVar2 = true, *(long *)(local_10 + 0x10) == 0)) {
      bVar2 = *(long *)(local_10 + 0x18) != 0;
    }
    lVar1 = local_10;
    if (!bVar2) break;
    if (*(long *)(local_10 + 0x10) == 0) {
      local_28 = *(long *)(local_10 + 0x18);
    }
    else {
      local_28 = *(long *)(local_10 + 0x10);
    }
    local_10 = local_28;
  }
  while (local_10 = lVar1, local_10 != 0) {
    lVar1 = *(long *)(local_10 + 8);
    fts3FreeExprNode((Fts3Expr *)0x24af13);
    if (((lVar1 != 0) && (local_10 == *(long *)(lVar1 + 0x10))) && (*(long *)(lVar1 + 0x18) != 0)) {
      local_10 = *(long *)(lVar1 + 0x18);
      while( true ) {
        bVar2 = false;
        if ((local_10 != 0) && (bVar2 = true, *(long *)(local_10 + 0x10) == 0)) {
          bVar2 = *(long *)(local_10 + 0x18) != 0;
        }
        lVar1 = local_10;
        if (!bVar2) break;
        if (*(long *)(local_10 + 0x10) == 0) {
          local_38 = *(long *)(local_10 + 0x18);
        }
        else {
          local_38 = *(long *)(local_10 + 0x10);
        }
        local_10 = local_38;
      }
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3Fts3ExprFree(Fts3Expr *pDel){
  Fts3Expr *p;
  assert( pDel==0 || pDel->pParent==0 );
  for(p=pDel; p && (p->pLeft||p->pRight); p=(p->pLeft ? p->pLeft : p->pRight)){
    assert( p->pParent==0 || p==p->pParent->pRight || p==p->pParent->pLeft );
  }
  while( p ){
    Fts3Expr *pParent = p->pParent;
    fts3FreeExprNode(p);
    if( pParent && p==pParent->pLeft && pParent->pRight ){
      p = pParent->pRight;
      while( p && (p->pLeft || p->pRight) ){
        assert( p==p->pParent->pRight || p==p->pParent->pLeft );
        p = (p->pLeft ? p->pLeft : p->pRight);
      }
    }else{
      p = pParent;
    }
  }
}